

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execAddiEa<(moira::Instr)6,(moira::Mode)4,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  uint op1;
  ushort in_SI;
  Moira *in_RDI;
  u32 result;
  u32 data;
  u32 ea;
  int dst;
  u32 src;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  u32 in_stack_ffffffffffffffe8;
  undefined2 in_stack_fffffffffffffff4;
  Moira *this_00;
  
  this_00 = in_RDI;
  uVar2 = readI<(moira::Size)1>
                    ((Moira *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  op1 = in_SI & 7;
  bVar1 = readOp<(moira::Mode)4,(moira::Size)1,64ul>
                    (this_00,CONCAT22(in_SI,in_stack_fffffffffffffff4),
                     (u32 *)((ulong)CONCAT24(in_SI,in_stack_ffffffffffffffe8) & 0x7ffffffff),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (bVar1) {
    uVar2 = addsub<(moira::Instr)6,(moira::Size)1>
                      ((Moira *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,uVar2)),op1,
                       in_stack_ffffffffffffffe8);
    prefetch<0ul>((Moira *)CONCAT44(in_stack_ffffffffffffffe4,uVar2));
    writeOp<(moira::Mode)4,(moira::Size)1,4ul>
              ((Moira *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),(int)((ulong)in_RDI >> 0x20),
               (u32)in_RDI,0);
  }
  return;
}

Assistant:

void
Moira::execAddiEa(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 ea, data, result;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = addsub<I,S>(src, data);
    prefetch();

    writeOp<M,S, POLLIPL>(dst, ea, result);
}